

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void uavs3d_if_hor_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (0 < height) {
    iVar3 = 0;
    do {
      if (0 < width) {
        lVar4 = 0;
        do {
          iVar1 = (int)((uint)src[lVar4 + 2] * (int)coeff[2] +
                        (uint)src[lVar4] * (int)coeff[1] + (uint)src[lVar4 + -2] * (int)*coeff +
                        (uint)src[lVar4 + 4] * (int)coeff[3] + 0x20) >> 6;
          if (max_val <= iVar1) {
            iVar1 = max_val;
          }
          if (iVar1 < 1) {
            iVar1 = 0;
          }
          iVar2 = (int)((uint)src[lVar4 + 5] * (int)coeff[3] +
                        (uint)src[lVar4 + 3] * (int)coeff[2] +
                        (uint)src[lVar4 + 1] * (int)coeff[1] + (uint)src[lVar4 + -1] * (int)*coeff +
                       0x20) >> 6;
          dst[lVar4] = (pel)iVar1;
          if (max_val <= iVar2) {
            iVar2 = max_val;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          dst[lVar4 + 1] = (pel)iVar2;
          lVar4 = lVar4 + 2;
        } while (lVar4 < width);
      }
      src = src + i_src;
      dst = dst + i_dst;
      iVar3 = iVar3 + 1;
    } while (iVar3 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_HOR(src, col, coeff);
            sumv = FLT_4TAP_HOR(src, col + 1, coeff);
            valu = (sumu + 32) >> 6;
            valv = (sumv + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        src += i_src;
        dst += i_dst;
    }
}